

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
Pass2thread::Pass2thread(Pass2thread *this,client_socket *_client,string *log_file,int _idx)

{
  pointer pcVar1;
  
  (this->client).sockfd = _client->sockfd;
  (this->client).ip._M_dataplus._M_p = (pointer)&(this->client).ip.field_2;
  pcVar1 = (_client->ip)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->client).ip,pcVar1,pcVar1 + (_client->ip)._M_string_length);
  (this->client).port = _client->port;
  Log::Log(&this->log,log_file);
  this->idx = _idx;
  return;
}

Assistant:

Pass2thread(C_std::Network::client_socket _client, const string &log_file, int _idx)
            : client(_client)
            , log(log_file)
            , idx(_idx)
    {}